

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

Datatype * __thiscall TypeOpCall::getInputLocal(TypeOpCall *this,PcodeOp *op,int4 slot)

{
  Varnode *pVVar1;
  uintb uVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  Datatype *pDVar6;
  
  if (slot != 0) {
    pVVar1 = *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((pVVar1->loc).base)->type == IPTR_FSPEC) {
      uVar2 = (pVVar1->loc).offset;
      iVar4 = (**(code **)(**(long **)(uVar2 + 8) + 0x28))();
      if ((iVar4 == (int)((ulong)((long)(op->inrefs).
                                        super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(op->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 3) + -1) ||
         ((*(byte *)(uVar2 + 0x14) & 1) != 0)) {
        plVar5 = (long *)(**(code **)(**(long **)(uVar2 + 8) + 0x30))
                                   (*(long **)(uVar2 + 8),slot + -1);
        if (plVar5 != (long *)0x0) {
          cVar3 = (**(code **)(*plVar5 + 0x30))(plVar5);
          if (cVar3 != '\0') {
            pDVar6 = (Datatype *)(**(code **)(*plVar5 + 0x18))(plVar5);
            if ((pDVar6->metatype != TYPE_VOID) &&
               (pDVar6->size <=
                (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start[slot]->size)) {
              return pDVar6;
            }
          }
        }
      }
    }
  }
  pDVar6 = TypeOp::getInputLocal(&this->super_TypeOp,op,slot);
  return pDVar6;
}

Assistant:

Datatype *TypeOpCall::getInputLocal(const PcodeOp *op,int4 slot) const

{
  const FuncCallSpecs *fc;
  const Varnode *vn;
  Datatype *ct;

  vn = op->getIn(0);
  if ((slot==0)||(vn->getSpace()->getType()!=IPTR_FSPEC))// Do we have a prototype to look at
    return TypeOp::getInputLocal(op,slot);
    
  // Get types of call input parameters
  fc = FuncCallSpecs::getFspecFromConst(vn->getAddr());
  // Its false to assume that the parameter symbol corresponds
  // to the varnode in the same slot, but this is easiest until
  // we get giant sized parameters working properly
  if ((fc->numParams() == op->numInput()-1)||(fc->isDotdotdot())) {
    ProtoParameter *param = fc->getParam(slot-1);
    if ((param != (ProtoParameter *)0)&&(param->isTypeLocked())) {
      ct = param->getType();
      if ((ct->getMetatype() != TYPE_VOID)&&
	  (ct->getSize() <= op->getIn(slot)->getSize())) // parameter may not match varnode
	return ct;
    }
  }
  return TypeOp::getInputLocal(op,slot);
}